

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiMessage.cpp
# Opt level: O2

void __thiscall
smf::MidiMessage::makeTemperamentBad
          (MidiMessage *this,double maxDeviationCents,int referencePitchClass,int channelMask)

{
  int iVar1;
  double *item;
  pointer pdVar2;
  double dVar3;
  allocator_type local_49;
  double local_48;
  vector<double,_std::allocator<double>_> temperament;
  
  dVar3 = -maxDeviationCents;
  if (-maxDeviationCents <= maxDeviationCents) {
    dVar3 = maxDeviationCents;
  }
  local_48 = 100.0;
  if (dVar3 <= 100.0) {
    local_48 = dVar3;
  }
  std::vector<double,_std::allocator<double>_>::vector(&temperament,0xc,&local_49);
  for (pdVar2 = temperament.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start;
      pdVar2 != temperament.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish; pdVar2 = pdVar2 + 1) {
    iVar1 = rand();
    *pdVar2 = ((double)iVar1 / 2147483647.0 + (double)iVar1 / 2147483647.0 + -1.0) * local_48;
  }
  makeMts9_TemperamentByCentsDeviationFromET(this,&temperament,referencePitchClass,channelMask);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&temperament.super__Vector_base<double,_std::allocator<double>_>);
  return;
}

Assistant:

void MidiMessage::makeTemperamentBad(double maxDeviationCents, int referencePitchClass, int channelMask) {
	if (maxDeviationCents < 0.0) {
		maxDeviationCents = -maxDeviationCents;
	}
	if (maxDeviationCents > 100.0) {
		maxDeviationCents = 100.0;
	}
	std::vector<double> temperament(12);
	for (double &item : temperament) {
		item = ((rand() / (double)RAND_MAX) * 2.0 - 1.0) * maxDeviationCents;
	}
	this->makeMts9_TemperamentByCentsDeviationFromET(temperament, referencePitchClass, channelMask);
}